

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O3

void llvm::cl::HideUnrelatedOptions(OptionCategory *Category,SubCommand *Sub)

{
  StringMapEntryBase **ppSVar1;
  size_t sVar2;
  StringMapEntryBase **ppSVar3;
  ulong uVar4;
  StringMapEntryBase *pSVar5;
  
  ppSVar1 = (Sub->OptionsMap).super_StringMapImpl.TheTable;
  uVar4 = (ulong)(Sub->OptionsMap).super_StringMapImpl.NumBuckets;
  ppSVar3 = ppSVar1;
  if (uVar4 != 0) {
    for (; (*ppSVar3 == (StringMapEntryBase *)0x0 ||
           (*ppSVar3 == (StringMapEntryBase *)0xfffffffffffffff8)); ppSVar3 = ppSVar3 + 1) {
    }
  }
  if (ppSVar3 != ppSVar1 + uVar4) {
    pSVar5 = *ppSVar3;
    do {
      sVar2 = pSVar5[1].StrLen;
      if (*(OptionCategory **)(sVar2 + 0x48) != &GenericCategory &&
          *(OptionCategory **)(sVar2 + 0x48) != Category) {
        *(ushort *)(sVar2 + 0xc) = (ushort)*(undefined4 *)(sVar2 + 0xc) & 0xff9f | 0x40;
      }
      do {
        do {
          ppSVar3 = ppSVar3 + 1;
          pSVar5 = *ppSVar3;
        } while (pSVar5 == (StringMapEntryBase *)0x0);
      } while (pSVar5 == (StringMapEntryBase *)0xfffffffffffffff8);
    } while (ppSVar3 != ppSVar1 + uVar4);
  }
  return;
}

Assistant:

iterator begin() {
    return iterator(TheTable, NumBuckets == 0);
  }